

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O3

int PredictMultiple(void *hPtr,char *input,char ***predictedLabels,float *predictedProbabilities,
                   int n)

{
  ulong uVar1;
  bool bVar2;
  char **ppcVar3;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  pointer ppVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  double dVar10;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  predictions;
  istringstream inStream;
  allocator<char> local_1fd;
  uint local_1fc;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f8;
  long *local_1e0 [2];
  long local_1d0 [2];
  char ***local_1c0;
  float *local_1b8;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_1f8.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8 = predictedProbabilities;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1e0,input,&local_1fd);
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)local_1e0,_S_in);
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  bVar2 = fasttext::FastText::predictLine((FastText *)hPtr,(istream *)local_1b0,&local_1f8,n,0.0);
  ppVar7 = local_1f8.
           super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = 0;
  if (bVar2) {
    uVar6 = 0;
    if ((long)local_1f8.
              super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_1f8.
              super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = ((long)local_1f8.
                     super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1f8.
                     super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      auVar9._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar9._0_8_ = lVar5;
      auVar9._12_4_ = 0x45300000;
      dVar10 = (auVar9._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
      if ((double)n <= dVar10) {
        dVar10 = (double)n;
      }
      uVar6 = (uint)dVar10;
      uVar8 = 0xffffffffffffffff;
      if (-1 < (int)uVar6) {
        uVar8 = (long)(int)uVar6 * 8;
      }
      local_1c0 = predictedLabels;
      ppcVar3 = (char **)operator_new__(uVar8);
      local_1fc = uVar6;
      if (0 < (int)uVar6) {
        lVar5 = 8;
        uVar8 = 0;
        do {
          uVar1 = *(ulong *)((long)&(ppVar7->second)._M_dataplus._M_p + lVar5);
          pcVar4 = (char *)operator_new__(uVar1 + 1);
          ppcVar3[uVar8] = pcVar4;
          std::__cxx11::string::copy((char *)((long)&ppVar7->first + lVar5),(ulong)pcVar4,uVar1);
          ppcVar3[uVar8][uVar1] = '\0';
          local_1b8[uVar8] =
               *(float *)((long)local_1f8.
                                super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar5 + -8);
          uVar8 = uVar8 + 1;
          lVar5 = lVar5 + 0x28;
          ppVar7 = local_1f8.
                   super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar6 != uVar8);
      }
      *local_1c0 = ppcVar3;
      uVar6 = local_1fc;
    }
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_1f8);
  return uVar6;
}

Assistant:

PredictMultiple(void* hPtr, const char* input, char*** predictedLabels, float* predictedProbabilities, int n)
{
    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    std::vector<std::pair<real,std::string>> predictions;
    std::istringstream inStream(input);

    try {
        if (!fastText->predictLine(inStream, predictions, n, 0)) {
            return 0;
        }

        if (predictions.size()==0) {
            return 0;
        }
    }
    catch (std::exception& e) {
        _lastError = std::string(e.what());
        return -1;
    }
    catch (...) {
        _lastError = "Unknown error";
        return -1;
    }

    int cnt = fmin(predictions.size(), n);
    auto labels = new char*[cnt];
    for (int i = 0; i < cnt; ++i)
    {
        auto len = predictions[i].second.length();
        labels[i] = new char[len + 1];
        predictions[i].second.copy(labels[i], len);
        labels[i][len] = '\0';
        predictedProbabilities[i] = predictions[i].first;
    }

    *(predictedLabels) = labels;

    return cnt;
}